

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O3

void __thiscall
InterpreterTestSuite_PC_EnergyScan_Test::~InterpreterTestSuite_PC_EnergyScan_Test
          (InterpreterTestSuite_PC_EnergyScan_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, PC_EnergyScan)
{
    TestContext ctx;
    InitContext(ctx);

    EXPECT_CALL(*ctx.mDefaultCommissionerObject, EnergyScan(_, _, _, _, _)).WillOnce(Return(Error{}));

    Interpreter::Expression expr;
    Interpreter::Value      value;

    expr  = ctx.mInterpreter.ParseExpression("energy scan 1 2 3 4 1234::5678");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());
}